

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoder_init_vfs_w
                    (ma_vfs *pVFS,wchar_t *pFilePath,ma_decoder_config *pConfig,ma_decoder *pDecoder
                    )

{
  ma_result mVar1;
  ma_bool32 mVar2;
  ma_decoder_config *pConfig_00;
  ma_decoder *pDecoder_00;
  ma_decoder_config config;
  ma_decoder_config config_1;
  undefined1 auStack_148 [144];
  ma_vfs_file local_b8 [18];
  
  pDecoder_00 = (ma_decoder *)auStack_148;
  if (pConfig == (ma_decoder_config *)0x0) {
    memset(local_b8,0,0x90);
  }
  else {
    memcpy(local_b8,pConfig,0x90);
  }
  memcpy(auStack_148,local_b8,0x90);
  mVar1 = ma_decoder__preinit(ma_decoder__on_read_vfs,ma_decoder__on_seek_vfs,
                              ma_decoder__on_tell_vfs,(void *)0x0,(ma_decoder_config *)auStack_148,
                              pDecoder);
  if ((((mVar1 == MA_SUCCESS) && (mVar1 = MA_INVALID_ARGS, pFilePath != (wchar_t *)0x0)) &&
      (*pFilePath != L'\0')) &&
     (mVar1 = ma_vfs_or_default_open_w(pVFS,pFilePath,1,local_b8), mVar1 == MA_SUCCESS)) {
    (pDecoder->data).vfs.pVFS = pVFS;
    (pDecoder->data).vfs.file = local_b8[0];
    mVar1 = MA_SUCCESS;
  }
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  pConfig_00 = (ma_decoder_config *)(ulong)(uint)auStack_148._112_4_;
  if (auStack_148._112_4_ == ma_encoding_format_unknown) {
LAB_0015054a:
    mVar1 = ma_decoder_init_custom__internal((ma_decoder_config *)auStack_148,pDecoder);
    if (mVar1 != MA_SUCCESS) {
      pConfig_00 = (ma_decoder_config *)0x0;
      ma_vfs_or_default_seek
                ((pDecoder->data).vfs.pVFS,(pDecoder->data).vfs.file,0,ma_seek_origin_start);
    }
    if (auStack_148._112_4_ != ma_encoding_format_unknown) {
      return MA_NO_BACKEND;
    }
    if (mVar1 != MA_SUCCESS) {
      mVar2 = ma_path_extension_equal_w(pFilePath,L"wav");
      if (mVar2 != 0) {
        mVar1 = ma_decoder_init_from_vtable__internal
                          (&g_ma_decoding_backend_vtable_wav,(void *)0x0,
                           (ma_decoder_config *)auStack_148,pDecoder);
        if (mVar1 == MA_SUCCESS) goto LAB_001506c7;
        pConfig_00 = (ma_decoder_config *)0x0;
        ma_vfs_or_default_seek
                  ((pDecoder->data).vfs.pVFS,(pDecoder->data).vfs.file,0,ma_seek_origin_start);
      }
      mVar2 = ma_path_extension_equal_w(pFilePath,L"flac");
      if (mVar2 != 0) {
        mVar1 = ma_decoder_init_from_vtable__internal
                          (&g_ma_decoding_backend_vtable_flac,(void *)0x0,
                           (ma_decoder_config *)auStack_148,pDecoder);
        if (mVar1 == MA_SUCCESS) goto LAB_001506c7;
        pConfig_00 = (ma_decoder_config *)0x0;
        ma_vfs_or_default_seek
                  ((pDecoder->data).vfs.pVFS,(pDecoder->data).vfs.file,0,ma_seek_origin_start);
      }
      mVar2 = ma_path_extension_equal_w(pFilePath,L"mp3");
      if (mVar2 != 0) {
        mVar1 = ma_decoder_init_from_vtable__internal
                          (&g_ma_decoding_backend_vtable_mp3,(void *)0x0,
                           (ma_decoder_config *)auStack_148,pDecoder);
        if (mVar1 == MA_SUCCESS) goto LAB_001506c7;
        pConfig_00 = (ma_decoder_config *)0x0;
        ma_vfs_or_default_seek
                  ((pDecoder->data).vfs.pVFS,(pDecoder->data).vfs.file,0,ma_seek_origin_start);
      }
      mVar1 = ma_decoder_init__internal
                        (ma_decoder__on_seek_vfs,(ma_decoder_seek_proc)auStack_148,pDecoder,
                         pConfig_00,pDecoder_00);
      goto LAB_001506d2;
    }
  }
  else {
    mVar1 = MA_NO_BACKEND;
    if (auStack_148._112_4_ == ma_encoding_format_wav) {
      mVar1 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_wav,(void *)0x0,
                         (ma_decoder_config *)auStack_148,pDecoder);
    }
    if (auStack_148._112_4_ == ma_encoding_format_flac) {
      mVar1 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_flac,(void *)0x0,
                         (ma_decoder_config *)auStack_148,pDecoder);
    }
    if (auStack_148._112_4_ == ma_encoding_format_mp3) {
      mVar1 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_mp3,(void *)0x0,
                         (ma_decoder_config *)auStack_148,pDecoder);
    }
    if (auStack_148._112_4_ == ma_encoding_format_vorbis) {
      mVar1 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_stbvorbis,(void *)0x0,
                         (ma_decoder_config *)auStack_148,pDecoder);
    }
    if (mVar1 != MA_SUCCESS) {
      pConfig_00 = (ma_decoder_config *)0x0;
      ma_vfs_or_default_seek
                ((pDecoder->data).vfs.pVFS,(pDecoder->data).vfs.file,0,ma_seek_origin_start);
      goto LAB_0015054a;
    }
  }
LAB_001506c7:
  mVar1 = ma_decoder__postinit((ma_decoder_config *)auStack_148,pDecoder);
LAB_001506d2:
  if (mVar1 == MA_SUCCESS) {
    mVar1 = MA_SUCCESS;
  }
  else {
    ma_vfs_or_default_close(pVFS,(pDecoder->data).vfs.file);
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_init_vfs_w(ma_vfs* pVFS, const wchar_t* pFilePath, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoder_config config;

    config = ma_decoder_config_init_copy(pConfig);
    result = ma_decoder__preinit_vfs_w(pVFS, pFilePath, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = MA_NO_BACKEND;

    if (config.encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (config.encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (config.encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (config.encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (config.encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis__internal(&config, pDecoder);
        }
    #endif

        /* Make sure we seek back to the start if we didn't initialize a decoder successfully so the next attempts have a fresh start. */
        if (result != MA_SUCCESS) {
            ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
        }
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we weren't able to initialize a decoder of a specific encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_custom__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (config.encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

    #ifdef MA_HAS_WAV
        if (result != MA_SUCCESS && ma_path_extension_equal_w(pFilePath, L"wav")) {
            result = ma_decoder_init_wav__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (result != MA_SUCCESS && ma_path_extension_equal_w(pFilePath, L"flac")) {
            result = ma_decoder_init_flac__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_MP3
        if (result != MA_SUCCESS && ma_path_extension_equal_w(pFilePath, L"mp3")) {
            result = ma_decoder_init_mp3__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    }

    /* If we still haven't got a result just use trial and error. Otherwise we can finish up. */
    if (result != MA_SUCCESS) {
        result = ma_decoder_init__internal(ma_decoder__on_read_vfs, ma_decoder__on_seek_vfs, NULL, &config, pDecoder);
    } else {
        result = ma_decoder__postinit(&config, pDecoder);
    }

    if (result != MA_SUCCESS) {
        ma_vfs_or_default_close(pVFS, pDecoder->data.vfs.file);
        return result;
    }

    return MA_SUCCESS;
}